

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithipublisher.cpp
# Opt level: O2

bool __thiscall
ithipublisher::PrintVector
          (ithipublisher *this,FILE *F,vector<double,_std::allocator<double>_> *vx,double mult)

{
  int iVar1;
  pointer pdVar2;
  bool bVar3;
  size_t i;
  ulong uVar4;
  
  iVar1 = fprintf((FILE *)F,"[");
  bVar3 = 0 < iVar1;
  uVar4 = 0;
  while( true ) {
    pdVar2 = (vx->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(vx->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar2 >> 3) <= uVar4) break;
    if (uVar4 != 0) {
      iVar1 = fprintf((FILE *)F,", ");
      bVar3 = (bool)(bVar3 & 0 < iVar1);
      pdVar2 = (vx->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    iVar1 = fprintf((FILE *)F,"%8f",pdVar2[uVar4] * mult);
    bVar3 = (bool)(bVar3 & 0 < iVar1);
    uVar4 = uVar4 + 1;
  }
  iVar1 = fprintf((FILE *)F,"]");
  return (bool)(bVar3 & 0 < iVar1);
}

Assistant:

bool ithipublisher::PrintVector(FILE * F, std::vector<double> * vx, double mult)
{
    bool ret = (fprintf(F, "[") > 0);
    for (size_t i = 0; i < vx->size(); i++)
    {
        if (i != 0)
        {
            ret &= fprintf(F, ", ") > 0;
        }

        ret &= fprintf(F, "%8f", mult*(*vx)[i]) > 0;
    }

    ret &= fprintf(F, "]") > 0;

    return ret;
}